

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

int __thiscall
FIWadManager::IdentifyVersion
          (FIWadManager *this,TArray<FString,_FString> *wadfiles,char *iwad,char *zdoom_wad)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  WadStuff *pWVar8;
  FIWADInfo *pFVar9;
  WadStuff *pWVar10;
  FIWADInfo *other;
  char *__s2;
  FString *pFVar11;
  FString local_120;
  FString local_118;
  FString path;
  long lastslash;
  uint i_2;
  FString basename_1;
  FString local_f0;
  FString basename;
  int defiwad;
  uint j_2;
  size_t j_1;
  size_t kill;
  uint j;
  undefined1 local_c0 [3];
  bool found;
  uint i_1;
  TArray<FString,_FString> steam_path;
  TArray<FString,_FString> gog_paths;
  FString nice;
  char *value;
  char *key;
  FString custwad;
  size_t sStack_78;
  bool iwadparmfound;
  size_t i;
  size_t numwads;
  char *pcStack_60;
  int pickwad;
  char *iwadparm;
  undefined1 local_48 [8];
  TArray<unsigned_long,_unsigned_long> foundwads;
  TArray<WadStuff,_WadStuff> wads;
  char *zdoom_wad_local;
  char *iwad_local;
  TArray<FString,_FString> *wadfiles_local;
  FIWadManager *this_local;
  
  TArray<WadStuff,_WadStuff>::TArray((TArray<WadStuff,_WadStuff> *)&foundwads.Most);
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)local_48);
  pcStack_60 = DArgs::CheckValue(Args,"-iwad");
  custwad.Chars._7_1_ = 0;
  FString::FString((FString *)&key);
  uVar3 = TArray<FString,_FString>::Size(&this->mIWadNames);
  TArray<WadStuff,_WadStuff>::Resize((TArray<WadStuff,_WadStuff> *)&foundwads.Most,uVar3);
  uVar3 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads);
  TArray<unsigned_long,_unsigned_long>::Resize
            ((TArray<unsigned_long,_unsigned_long> *)local_48,uVar3);
  puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                     ((TArray<unsigned_long,_unsigned_long> *)local_48,0);
  uVar3 = TArray<unsigned_long,_unsigned_long>::Size
                    ((TArray<unsigned_long,_unsigned_long> *)local_48);
  memset(puVar6,0,(ulong)uVar3 << 3);
  if (((pcStack_60 == (char *)0x0) && (iwad != (char *)0x0)) && (*iwad != '\0')) {
    pcStack_60 = iwad;
  }
  if (pcStack_60 != (char *)0x0) {
    FString::operator=((FString *)&key,pcStack_60);
    FixPathSeperator((FString *)&key);
    pcVar7 = FString::operator_cast_to_char_((FString *)&key);
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0)
    ;
    iVar4 = CheckIWAD(this,pcVar7,pWVar8);
    if (iVar4 == 0) {
      DefaultExtension((FString *)&key,".wad");
      pcStack_60 = FString::operator_cast_to_char_((FString *)&key);
      pFVar11 = TArray<FString,_FString>::operator[](&this->mIWadNames,0);
      FString::operator=(pFVar11,(FString *)&key);
      pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                         ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0);
      CheckIWAD(this,"",pWVar8);
    }
    else {
      pcStack_60 = (char *)0x0;
    }
  }
  if (pcStack_60 != (char *)0x0) {
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0)
    ;
    bVar2 = FString::IsEmpty(&pWVar8->Path);
    if (!bVar2) {
      pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                         ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0);
      pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(long)pWVar8->Type);
      bVar2 = FString::IsNotEmpty(&pFVar9->Required);
      if (!bVar2) goto LAB_0058e0c5;
    }
  }
  bVar2 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,"IWADSearch.Directories",false);
  if (bVar2) {
    while (bVar2 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&value,&nice.Chars),
          bVar2) {
      iVar4 = strcasecmp(value,"Path");
      if (iVar4 == 0) {
        NicePath((char *)&gog_paths.Most);
        FixPathSeperator((FString *)&gog_paths.Most);
        pcVar7 = FString::operator_cast_to_char_((FString *)&gog_paths.Most);
        pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                           ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0);
        CheckIWAD(this,pcVar7,pWVar8);
        FString::~FString((FString *)&gog_paths.Most);
      }
    }
  }
  I_GetGogPaths();
  for (sStack_78 = 0;
      uVar3 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)&steam_path.Most),
      sStack_78 < uVar3; sStack_78 = sStack_78 + 1) {
    pFVar11 = TArray<FString,_FString>::operator[]
                        ((TArray<FString,_FString> *)&steam_path.Most,sStack_78);
    pcVar7 = FString::operator_cast_to_char_(pFVar11);
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0)
    ;
    CheckIWAD(this,pcVar7,pWVar8);
  }
  I_GetSteamPath();
  for (sStack_78 = 0; uVar3 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)local_c0),
      sStack_78 < uVar3; sStack_78 = sStack_78 + 1) {
    pFVar11 = TArray<FString,_FString>::operator[]((TArray<FString,_FString> *)local_c0,sStack_78);
    pcVar7 = FString::operator_cast_to_char_(pFVar11);
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0)
    ;
    CheckIWAD(this,pcVar7,pWVar8);
  }
  TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)local_c0);
  TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)&steam_path.Most);
LAB_0058e0c5:
  if (pcStack_60 != (char *)0x0) {
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0)
    ;
    bVar2 = FString::IsEmpty(&pWVar8->Path);
    if (!bVar2) {
      custwad.Chars._7_1_ = 1;
    }
  }
  i = 0;
  for (sStack_78 = 0; uVar3 = TArray<FString,_FString>::Size(&this->mIWadNames), sStack_78 < uVar3;
      sStack_78 = sStack_78 + 1) {
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,sStack_78);
    bVar2 = FString::IsEmpty(&pWVar8->Path);
    if (!bVar2) {
      if (sStack_78 != i) {
        pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                           ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,sStack_78);
        pWVar10 = TArray<WadStuff,_WadStuff>::operator[]
                            ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,i);
        WadStuff::operator=(pWVar10,pWVar8);
      }
      pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                         ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,i);
      puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                         ((TArray<unsigned_long,_unsigned_long> *)local_48,(long)pWVar8->Type);
      *puVar6 = i + 1;
      i = i + 1;
    }
  }
  for (j = 0; uVar3 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads), j < uVar3; j = j + 1) {
    pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)j);
    bVar2 = FString::IsNotEmpty(&pFVar9->Required);
    if ((bVar2) &&
       (puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                           ((TArray<unsigned_long,_unsigned_long> *)local_48,(ulong)j), *puVar6 != 0
       )) {
      bVar2 = false;
      for (kill._4_4_ = 0; uVar3 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads),
          kill._4_4_ < uVar3; kill._4_4_ = kill._4_4_ + 1) {
        pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)j);
        other = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)kill._4_4_);
        iVar4 = FString::Compare(&pFVar9->Required,&other->Name);
        if (iVar4 == 0) {
          puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                             ((TArray<unsigned_long,_unsigned_long> *)local_48,(ulong)kill._4_4_);
          bVar2 = *puVar6 != 0;
          if (bVar2) {
            pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)j);
            pFVar9->preload = kill._4_4_;
          }
          break;
        }
      }
      if (!bVar2) {
        puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                           ((TArray<unsigned_long,_unsigned_long> *)local_48,(ulong)j);
        uVar1 = *puVar6;
        for (_defiwad = uVar1; _defiwad < i; _defiwad = _defiwad + 1) {
          pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                             ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,_defiwad);
          pWVar10 = TArray<WadStuff,_WadStuff>::operator[]
                              ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,_defiwad - 1);
          WadStuff::operator=(pWVar10,pWVar8);
        }
        i = i - 1;
        puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                           ((TArray<unsigned_long,_unsigned_long> *)local_48,(ulong)j);
        *puVar6 = 0;
        for (basename.Chars._4_4_ = 0; uVar3 = basename.Chars._4_4_,
            uVar5 = TArray<unsigned_long,_unsigned_long>::Size
                              ((TArray<unsigned_long,_unsigned_long> *)local_48), uVar3 < uVar5;
            basename.Chars._4_4_ = basename.Chars._4_4_ + 1) {
          puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                             ((TArray<unsigned_long,_unsigned_long> *)local_48,
                              (ulong)basename.Chars._4_4_);
          if (uVar1 < *puVar6) {
            puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                               ((TArray<unsigned_long,_unsigned_long> *)local_48,
                                (ulong)basename.Chars._4_4_);
            *puVar6 = *puVar6 - 1;
          }
        }
      }
    }
  }
  if (i == 0) {
    I_FatalError(
                "Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\nDid you install GZDoom properly? You can do either of the following:\n\n1. Place one or more of these wads in ~/.config/gzdoom/.\n2. Edit your ~/.config/gzdoom/gzdoom.ini and add the directories of your\niwads to the list beneath [IWADSearch.Directories]"
                );
  }
  numwads._4_4_ = 0;
  if (((custwad.Chars._7_1_ & 1) == 0) && (1 < i)) {
    basename.Chars._0_4_ = 0;
    pcVar7 = FStringCVar::operator_cast_to_char_(&defaultiwad);
    if (*pcVar7 != '\0') {
      for (sStack_78 = 0; sStack_78 < i; sStack_78 = sStack_78 + 1) {
        pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                           ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,sStack_78);
        pcVar7 = FString::operator_cast_to_char_(&pWVar8->Path);
        ExtractFileBase((char *)&local_f0,SUB81(pcVar7,0));
        pcVar7 = FString::operator_cast_to_char_(&local_f0);
        __s2 = FStringCVar::operator_cast_to_char_(&defaultiwad);
        iVar4 = strcasecmp(pcVar7,__s2);
        if (iVar4 == 0) {
          basename.Chars._0_4_ = (int)sStack_78;
          basename_1.Chars._4_4_ = 0x19;
        }
        else {
          basename_1.Chars._4_4_ = 0;
        }
        FString::~FString(&local_f0);
        if (basename_1.Chars._4_4_ != 0) break;
      }
    }
    if ((havepicked & 1U) == 0) {
      pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                         ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,0);
      bVar2 = FBoolCVar::operator_cast_to_bool(&queryiwad);
      numwads._4_4_ = I_PickIWad(pWVar8,(int)i,bVar2,(int)basename.Chars);
      if (-1 < numwads._4_4_) {
        pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                           ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
        pcVar7 = FString::operator_cast_to_char_(&pWVar8->Path);
        ExtractFileBase(&stack0xffffffffffffff00,SUB81(pcVar7,0));
        pcVar7 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffff00);
        FStringCVar::operator=(&defaultiwad,pcVar7);
        FString::~FString((FString *)&stack0xffffffffffffff00);
      }
      if (numwads._4_4_ < 0) {
        exit(0);
      }
      havepicked = true;
    }
  }
  TArray<FString,_FString>::Clear(wadfiles);
  D_AddFile(wadfiles,zdoom_wad,true,-1);
  pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                     ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
  pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(long)pWVar8->Type);
  if (-1 < pFVar9->preload) {
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
    pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(long)pWVar8->Type);
    puVar6 = TArray<unsigned_long,_unsigned_long>::operator[]
                       ((TArray<unsigned_long,_unsigned_long> *)local_48,(long)pFVar9->preload);
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,*puVar6 - 1);
    pcVar7 = FString::operator_cast_to_char_(&pWVar8->Path);
    D_AddFile(wadfiles,pcVar7,true,-1);
  }
  pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                     ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
  pcVar7 = FString::operator_cast_to_char_(&pWVar8->Path);
  D_AddFile(wadfiles,pcVar7,true,-1);
  lastslash._4_4_ = 0;
  while( true ) {
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
    pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(long)pWVar8->Type);
    uVar3 = TArray<FString,_FString>::Size(&pFVar9->Load);
    if (uVar3 <= lastslash._4_4_) break;
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
    path.Chars = (char *)FString::LastIndexOf(&pWVar8->Path,'/');
    FString::FString(&local_118);
    if (path.Chars == (char *)0xffffffffffffffff) {
      FString::operator=(&local_118,"");
    }
    else {
      pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                         ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
      pcVar7 = FString::GetChars(&pWVar8->Path);
      FString::FString(&local_120,pcVar7,(size_t)(path.Chars + 1));
      FString::operator=(&local_118,&local_120);
      FString::~FString(&local_120);
    }
    pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                       ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
    pFVar9 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(long)pWVar8->Type);
    pFVar11 = TArray<FString,_FString>::operator[](&pFVar9->Load,(ulong)lastslash._4_4_);
    FString::operator+=(&local_118,pFVar11);
    pcVar7 = FString::operator_cast_to_char_(&local_118);
    D_AddFile(wadfiles,pcVar7,true,-1);
    FString::~FString(&local_118);
    lastslash._4_4_ = lastslash._4_4_ + 1;
  }
  pWVar8 = TArray<WadStuff,_WadStuff>::operator[]
                     ((TArray<WadStuff,_WadStuff> *)&foundwads.Most,(long)numwads._4_4_);
  iVar4 = pWVar8->Type;
  basename_1.Chars._4_4_ = 1;
  FString::~FString((FString *)&key);
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)local_48);
  TArray<WadStuff,_WadStuff>::~TArray((TArray<WadStuff,_WadStuff> *)&foundwads.Most);
  return iVar4;
}

Assistant:

int FIWadManager::IdentifyVersion (TArray<FString> &wadfiles, const char *iwad, const char *zdoom_wad)
{
	TArray<WadStuff> wads;
	TArray<size_t> foundwads;
	const char *iwadparm = Args->CheckValue ("-iwad");
	int pickwad;
	size_t numwads;
	size_t i;
	bool iwadparmfound = false;
	FString custwad;

	wads.Resize(mIWadNames.Size());
	foundwads.Resize(mIWads.Size());
	memset(&foundwads[0], 0, foundwads.Size() * sizeof(foundwads[0]));

	if (iwadparm == NULL && iwad != NULL && *iwad != 0)
	{
		iwadparm = iwad;
	}

	if (iwadparm)
	{
		custwad = iwadparm;
		FixPathSeperator (custwad);
		if (CheckIWAD (custwad, &wads[0]))
		{ // -iwad parameter was a directory
			iwadparm = NULL;
		}
		else
		{
			DefaultExtension (custwad, ".wad");
			iwadparm = custwad;
			mIWadNames[0] = custwad;
			CheckIWAD ("", &wads[0]);
		}
	}

	if (iwadparm == NULL || wads[0].Path.IsEmpty() || mIWads[wads[0].Type].Required.IsNotEmpty())
	{
		if (GameConfig->SetSection ("IWADSearch.Directories"))
		{
			const char *key;
			const char *value;

			while (GameConfig->NextInSection (key, value))
			{
				if (stricmp (key, "Path") == 0)
				{
					FString nice = NicePath(value);
					FixPathSeperator(nice);
					CheckIWAD(nice, &wads[0]);
				}
			}
		}
		TArray<FString> gog_paths = I_GetGogPaths();
		for (i = 0; i < gog_paths.Size(); ++i)
		{
			CheckIWAD (gog_paths[i], &wads[0]);
		}
		TArray<FString> steam_path = I_GetSteamPath();
		for (i = 0; i < steam_path.Size(); ++i)
		{
			CheckIWAD (steam_path[i], &wads[0]);
		}
	}

	if (iwadparm != NULL && !wads[0].Path.IsEmpty())
	{
		iwadparmfound = true;
	}

	for (i = numwads = 0; i < mIWadNames.Size(); i++)
	{
		if (!wads[i].Path.IsEmpty())
		{
			if (i != numwads)
			{
				wads[numwads] = wads[i];
			}
			foundwads[wads[numwads].Type] = numwads + 1;
			numwads++;
		}
	}

	for (unsigned i=0; i<mIWads.Size(); i++)
	{
		if (mIWads[i].Required.IsNotEmpty() && foundwads[i])
		{
			bool found = false;
			// needs to be loaded with another IWAD (HexenDK)
			for (unsigned j=0; j<mIWads.Size(); j++)
			{
				if (!mIWads[i].Required.Compare(mIWads[j].Name))
				{
					if (foundwads[j])
					{
						found = true;
						mIWads[i].preload = j;
					}
					break;
				}
			}
			// The required WAD is not there so this one can't be used and must be deleted from the list
			if (!found)
			{
				size_t kill = foundwads[i];
				for (size_t j = kill; j < numwads; ++j)
				{
					wads[j - 1] = wads[j];
				}
				numwads--;
				foundwads[i] = 0;
				for (unsigned j = 0; j < foundwads.Size(); ++j)
				{
					if (foundwads[j] > kill)
					{
						foundwads[j]--;
					}
				}

			}
		}
	}

	if (numwads == 0)
	{
		I_FatalError ("Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\n"
					  "Did you install " GAMENAME " properly? You can do either of the following:\n"
					  "\n"
#if defined(_WIN32)
					  "1. Place one or more of these wads in the same directory as " GAMENAME ".\n"
					  "2. Edit your " GAMENAMELOWERCASE "-username.ini and add the directories of your iwads\n"
					  "to the list beneath [IWADSearch.Directories]");
#elif defined(__APPLE__)
					  "1. Place one or more of these wads in ~/Library/Application Support/GZdoom/\n"
					  "2. Edit your ~/Library/Application Support/GZdoom/GZdoom.ini and add the directories\n"
					  "of your iwads to the list beneath [IWADSearch.Directories]");
#else
					  "1. Place one or more of these wads in ~/.config/" GAMENAMELOWERCASE "/.\n"
					  "2. Edit your ~/.config/" GAMENAMELOWERCASE "/" GAMENAMELOWERCASE ".ini and add the directories of your\n"
					  "iwads to the list beneath [IWADSearch.Directories]");
#endif
	}

	pickwad = 0;

	if (!iwadparmfound && numwads > 1)
	{
		int defiwad = 0;

		// Locate the user's prefered IWAD, if it was found.
		if (defaultiwad[0] != '\0')
		{
			for (i = 0; i < numwads; ++i)
			{
				FString basename = ExtractFileBase(wads[i].Path);
				if (stricmp(basename, defaultiwad) == 0)
				{
					defiwad = (int)i;
					break;
				}
			}
		}
		if (!havepicked)	// just use the first IWAD if the restart doesn't have a -iwad parameter. We cannot open the picker in fullscreen mode.
		{
			pickwad = I_PickIWad(&wads[0], (int)numwads, queryiwad, defiwad);
			if (pickwad >= 0)
			{
				// The newly selected IWAD becomes the new default
				FString basename = ExtractFileBase(wads[pickwad].Path);
				defaultiwad = basename;
			}
			if (pickwad < 0)
				exit(0);
			havepicked = true;
		}
	}

	// zdoom.pk3 must always be the first file loaded and the IWAD second.
	wadfiles.Clear();
	D_AddFile (wadfiles, zdoom_wad);

	if (mIWads[wads[pickwad].Type].preload >= 0)
	{
		D_AddFile (wadfiles, wads[foundwads[mIWads[wads[pickwad].Type].preload]-1].Path);
	}
	D_AddFile (wadfiles, wads[pickwad].Path);

	for (unsigned i=0; i < mIWads[wads[pickwad].Type].Load.Size(); i++)
	{
		long lastslash = wads[pickwad].Path.LastIndexOf ('/');
		FString path;

		if (lastslash == -1)
		{
			path = "";//  wads[pickwad].Path;
		}
		else
		{
			path = FString (wads[pickwad].Path.GetChars(), lastslash + 1);
		}
		path += mIWads[wads[pickwad].Type].Load[i];
		D_AddFile (wadfiles, path);

	}
	return wads[pickwad].Type;
}